

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

ssize_t copy_block(int fd_out,int fd_in,size_t nbyte)

{
  bool bVar1;
  ssize_t sVar2;
  size_t local_458;
  long local_438;
  size_t total;
  ssize_t rd;
  char buffer [1024];
  ulong local_20;
  size_t nbyte_local;
  int fd_in_local;
  int fd_out_local;
  
  local_438 = 0;
  local_20 = nbyte;
  while( true ) {
    bVar1 = false;
    if (local_20 != 0) {
      if (local_20 < 0x401) {
        local_458 = local_20;
      }
      else {
        local_458 = 0x400;
      }
      total = read_block(fd_in,&rd,local_458);
      bVar1 = 0 < (long)total;
    }
    if (!bVar1) break;
    sVar2 = write_block(fd_out,&rd,total);
    if (sVar2 < (long)total) {
      return -1;
    }
    local_438 = total + local_438;
    local_20 = local_20 - total;
  }
  if ((long)total < 0) {
    return total;
  }
  return local_438;
}

Assistant:

ssize_t copy_block(int fd_out, int fd_in, size_t nbyte) {
  char buffer[COPY_BLOCK_SIZE];
  ssize_t rd;
  size_t total;

  total = 0;
  while (nbyte > 0 && (rd = read_block(fd_in, buffer, nbyte > sizeof(buffer) ? sizeof(buffer) : nbyte)) > 0) {
    if (write_block(fd_out, buffer, rd) < rd) {
      return -1;
    }
    total += rd;
    nbyte -= rd;
  }
  if (rd < 0) {
    return rd;
  } else {
    return total;
  }
}